

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number __thiscall
chaiscript::detail::Cast_Helper<chaiscript::Boxed_Number>::cast
          (Cast_Helper<chaiscript::Boxed_Number> *this,Boxed_Value *ob,
          Type_Conversions_State *param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Number BVar1;
  Boxed_Value local_30;
  Type_Conversions_State *local_20;
  Type_Conversions_State *param_1_local;
  Boxed_Value *ob_local;
  
  local_20 = param_2;
  param_1_local = (Type_Conversions_State *)ob;
  ob_local = (Boxed_Value *)this;
  Boxed_Value::Boxed_Value(&local_30,ob);
  Boxed_Number::Boxed_Number((Boxed_Number *)this,&local_30);
  Boxed_Value::~Boxed_Value(&local_30);
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar1.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number cast(const Boxed_Value &ob, const Type_Conversions_State *) { return Boxed_Number(ob); }